

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_x509.cc
# Opt level: O0

int pkcs7_add_external_signature
              (CBB *out,X509 *sign_cert,EVP_PKEY *key,EVP_MD *md,BIO *data,bool use_key_id)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  EVP_MD_CTX *ctx;
  env_md_ctx_st *ctx_00;
  uint64_t signed_data_version;
  undefined1 local_70 [8];
  signer_info_data si_data;
  bool use_key_id_local;
  BIO *data_local;
  EVP_MD *md_local;
  EVP_PKEY *key_local;
  X509 *sign_cert_local;
  CBB *out_local;
  
  si_data._47_1_ = use_key_id;
  anon_unknown.dwarf_326db6::signer_info_data::signer_info_data((signer_info_data *)local_70);
  si_data.sign_ctx.ctx_.pctx_ops._0_1_ = si_data._47_1_ & 1;
  local_70 = (undefined1  [8])sign_cert;
  ctx = (EVP_MD_CTX *)
        bssl::internal::
        StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
        ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
               *)&si_data);
  iVar2 = EVP_DigestSignInit(ctx,(EVP_PKEY_CTX **)0x0,(EVP_MD *)md,(ENGINE *)0x0,(EVP_PKEY *)key);
  if (iVar2 != 0) {
    ctx_00 = bssl::internal::
             StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
             ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                    *)&si_data);
    bVar1 = digest_sign_update(ctx_00,data);
    if (bVar1) {
      uVar3 = 1;
      if ((si_data._47_1_ & 1) != 0) {
        uVar3 = 3;
      }
      out_local._4_4_ =
           pkcs7_add_signed_data
                     (out,(ulong)uVar3,write_signer_digest_algos,(_func_int_CBB_ptr_void_ptr *)0x0,
                      write_signer_info,local_70);
      goto LAB_002f83cc;
    }
  }
  out_local._4_4_ = 0;
LAB_002f83cc:
  anon_unknown.dwarf_326db6::signer_info_data::~signer_info_data((signer_info_data *)local_70);
  return out_local._4_4_;
}

Assistant:

int pkcs7_add_external_signature(CBB *out, X509 *sign_cert, EVP_PKEY *key,
                                 const EVP_MD *md, BIO *data, bool use_key_id) {
  signer_info_data si_data;
  si_data.use_key_id = use_key_id;
  si_data.sign_cert = sign_cert;

  // Set up the signature.
  if (!EVP_DigestSignInit(si_data.sign_ctx.get(), nullptr, md, nullptr, key) ||
      !digest_sign_update(si_data.sign_ctx.get(), data)) {
    return 0;
  }

  // See RFC 5652, Section 5.1. When no certificates are present, the version
  // comes from the highest SignerInfo version, which will be 3 (CMS) for a key
  // ID, and 1 (CMS or PKCS#7) for issuer and serial.
  uint64_t signed_data_version = use_key_id ? 3u : 1u;
  return pkcs7_add_signed_data(
      out, signed_data_version, write_signer_digest_algos,
      /*cert_crl_cb=*/nullptr, write_signer_info, &si_data);
}